

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver_factory.cpp
# Opt level: O3

shared_ptr<cpp_db::driver_interface> __thiscall
cpp_db::driver_factory::create_driver(driver_factory *this,string *name)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  const_iterator cVar2;
  runtime_error *this_00;
  undefined8 uVar3;
  key_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pointer *__ptr;
  char unaff_BPL;
  shared_ptr<cpp_db::driver_interface> sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  __mutex = (pthread_mutex_t *)((long)&name[1].field_2 + 8);
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 == 0) {
    cVar2 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<cpp_db::driver_interface,_std::default_delete<cpp_db::driver_interface>_>_()>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<cpp_db::driver_interface,_std::default_delete<cpp_db::driver_interface>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<cpp_db::driver_interface,_std::default_delete<cpp_db::driver_interface>_>_()>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<cpp_db::driver_interface,_std::default_delete<cpp_db::driver_interface>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)name,in_RDX);
    if (cVar2.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<cpp_db::driver_interface,_std::default_delete<cpp_db::driver_interface>_>_()>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      if (*(long *)((long)cVar2.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<cpp_db::driver_interface,_std::default_delete<cpp_db::driver_interface>_>_()>_>,_true>
                          ._M_cur + 0x38) == 0) {
        uVar3 = std::__throw_bad_function_call();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
        if (unaff_BPL != '\0') {
          __cxa_free_exception(this);
        }
        pthread_mutex_unlock(__mutex);
        _Unwind_Resume(uVar3);
      }
      (**(code **)((long)cVar2.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<cpp_db::driver_interface,_std::default_delete<cpp_db::driver_interface>_>_()>_>,_true>
                         ._M_cur + 0x40))
                (&local_48,
                 (long)cVar2.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<cpp_db::driver_interface,_std::default_delete<cpp_db::driver_interface>_>_()>_>,_true>
                       ._M_cur + 0x28);
      std::__shared_ptr<cpp_db::driver_interface,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<cpp_db::driver_interface,std::default_delete<cpp_db::driver_interface>,void>
                ((__shared_ptr<cpp_db::driver_interface,(__gnu_cxx::_Lock_policy)2> *)this,
                 (unique_ptr<cpp_db::driver_interface,_std::default_delete<cpp_db::driver_interface>_>
                  *)&local_48);
      if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
      }
      pthread_mutex_unlock(__mutex);
      sVar4.super___shared_ptr<cpp_db::driver_interface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = extraout_RDX._M_pi;
      sVar4.super___shared_ptr<cpp_db::driver_interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (shared_ptr<cpp_db::driver_interface>)
             sVar4.super___shared_ptr<cpp_db::driver_interface,_(__gnu_cxx::_Lock_policy)2>;
    }
  }
  else {
    std::__throw_system_error(iVar1);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_48,"Driver not registered: ",in_RDX);
  std::runtime_error::runtime_error(this_00,(string *)&local_48);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<driver_interface> driver_factory::create_driver(const std::string &name) const
{
    std::lock_guard<std::mutex> lg(factory_mutex);
    auto pos = drivers.find(name);
    if (pos != std::end(drivers))
        return std::shared_ptr<driver_interface>(pos->second());
    throw std::runtime_error("Driver not registered: " + name);
}